

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# topological_sort.h
# Opt level: O0

void __thiscall
wasm::TopologicalSort<wasm::HeapType,_SubTypesFirstSort>::push
          (TopologicalSort<wasm::HeapType,_SubTypesFirstSort> *this,HeapType item)

{
  size_type sVar1;
  TopologicalSort<wasm::HeapType,_SubTypesFirstSort> *this_local;
  HeapType item_local;
  
  this_local = (TopologicalSort<wasm::HeapType,_SubTypesFirstSort> *)item.id;
  sVar1 = std::
          unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>
          ::count(&this->finished,(key_type *)&this_local);
  if (sVar1 == 0) {
    std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::push_back
              (&this->workStack,(value_type *)&this_local);
  }
  return;
}

Assistant:

void push(T item) {
    if (finished.count(item)) {
      return;
    }
    workStack.push_back(item);
  }